

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_set_noise_bits(fitsfile *fptr,int noisebits,int *status)

{
  uint uVar1;
  double dVar2;
  
  if (noisebits - 0x11U < 0xfffffff0) {
    *status = 0x19d;
    ffpmsg("illegal number of noise bits (fits_set_noise_bits)");
  }
  else {
    dVar2 = exp2((double)noisebits);
    uVar1 = -(uint)((float)dVar2 == 0.0);
    fptr->Fptr->request_quantize_level = (float)(~uVar1 & (uint)(float)dVar2 | uVar1 & 0x461c3c00);
  }
  return *status;
}

Assistant:

int fits_set_noise_bits(fitsfile *fptr,  /* I - FITS file pointer   */
           int noisebits,       /* noise_bits parameter value       */
                                /* (default = 4)                    */
           int *status)         /* IO - error status                */
{
/*
   ********************************************************************
   ********************************************************************
   THIS ROUTINE IS PROVIDED ONLY FOR BACKWARDS COMPATIBILITY;
   ALL NEW SOFTWARE SHOULD CALL fits_set_quantize_level INSTEAD
   ********************************************************************
   ********************************************************************

   This routine specifies the value of the noice_bits parameter that
   should be used when compressing floating point images.  The image is
   divided into tiles, and each tile is compressed and stored in a row
   of at variable length binary table column.

   Feb 2008:  the "noisebits" parameter has been replaced with the more
   general "quantize level" parameter.
*/
    float qlevel;

    if (noisebits < 1 || noisebits > 16)
    {
        *status = DATA_COMPRESSION_ERR;
	ffpmsg("illegal number of noise bits (fits_set_noise_bits)");
        return(*status);
    }

    qlevel = (float) pow (2., (double)noisebits);
    fits_set_quantize_level(fptr, qlevel, status);
    
    return(*status);
}